

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O2

void process_world(chunk *c)

{
  uint32_t *puVar1;
  wchar_t *pwVar2;
  ushort uVar3;
  uint16_t uVar4;
  int iVar5;
  object *poVar6;
  curse_data *pcVar7;
  loc_conflict grid;
  uint16_t *puVar8;
  trap *ptVar9;
  undefined8 uVar10;
  player_body body;
  chunk_conflict *pcVar11;
  curse *pcVar12;
  _Bool _Var13;
  _Bool _Var14;
  short sVar15;
  wchar_t wVar16;
  wchar_t wVar17;
  uint32_t uVar18;
  int iVar19;
  int16_t *piVar20;
  monster_conflict *mon;
  angband_constants *paVar21;
  queue *q;
  size_t sVar22;
  uintptr_t uVar23;
  loc lVar24;
  loc grid_00;
  player_upkeep *ppVar25;
  square *psVar26;
  trap **pptVar27;
  uint8_t uVar28;
  uint uVar29;
  ulong uVar30;
  char *fmt;
  player *ppVar31;
  long lVar32;
  chunk *c_00;
  byte bVar33;
  long lVar34;
  ulong uVar35;
  object **ppoVar36;
  bool bVar37;
  source sVar38;
  source origin;
  source origin_00;
  _Bool ident;
  player *local_80;
  loc_conflict local_78;
  ulong local_70;
  chunk *local_68;
  int local_5c;
  ulong local_58;
  ulong local_50;
  undefined4 *local_48;
  ulong local_40;
  ulong local_38;
  
  wVar16 = cave_monster_count((chunk_conflict *)c);
  if ((int)(uint)z_info->level_monster_max < wVar16 + L' ') {
    compact_monsters(c,L'@');
  }
  wVar16 = cave_monster_count((chunk_conflict *)c);
  wVar17 = cave_monster_max((chunk_conflict *)c);
  if (wVar16 + L' ' < wVar17) {
    compact_monsters(c,L'\0');
  }
  if (turn % (int)((uint)z_info->day_length * 10 >> 2) == 0) {
    play_ambient_sound();
  }
  if (player->depth == 0) {
    uVar3 = z_info->day_length;
    if (turn % (int)((uint)uVar3 + (uint)uVar3 * 4) == 0) {
      bVar37 = turn % (int)((uint)uVar3 * 10) == 0;
      fmt = "The sun has fallen.";
      if (bVar37) {
        fmt = "The sun has risen.";
      }
      msg(fmt);
      cave_illuminate(c,bVar37);
    }
  }
  else if (turn % (int)((uint)z_info->store_turns * 10) == 0) {
    daycount = daycount + 1;
  }
  _Var13 = flag_has_dbg((player->state).pflags,3,0xc,"player->state.pflags","(PF_UNLIGHT)");
  if (_Var13) {
    puVar1 = &player->upkeep->update;
    *puVar1 = *puVar1 | 1;
  }
  uVar18 = Rand_div((uint)z_info->alloc_monster_chance);
  if (uVar18 == 0) {
    pick_and_place_distant_monster
              (c,player->grid,(uint)z_info->max_sight + L'\x05',true,(int)player->depth);
  }
  ppVar31 = player;
  piVar20 = player->timed;
  if (piVar20[7] != 0) {
    wVar16 = player_apply_damage_reduction(player,L'\x01');
    take_hit(ppVar31,wVar16,"poison");
    if (player->is_dead != false) {
      return;
    }
    piVar20 = player->timed;
  }
  if (piVar20[8] != 0) {
    _Var13 = flag_has_dbg((player->state).pflags,3,0xd,"player->state.pflags","(PF_ROCK)");
    wVar16 = L'\0';
    if (!_Var13) {
      _Var13 = player_timed_grade_eq(player,L'\b',"Mortal Wound");
      wVar16 = L'\x03';
      if ((!_Var13) && (_Var13 = player_timed_grade_eq(player,L'\b',"Deep Gash"), !_Var13)) {
        _Var13 = player_timed_grade_eq(player,L'\b',"Severe Cut");
        wVar16 = (uint)_Var13 + L'\x01';
      }
    }
    ppVar31 = player;
    wVar16 = player_apply_damage_reduction(player,wVar16);
    take_hit(ppVar31,wVar16,"a fatal wound");
    if (player->is_dead != false) {
      return;
    }
    piVar20 = player->timed;
  }
  sVar15 = piVar20[0x31];
  if (sVar15 != 0) {
    wVar16 = L'\0';
    if (sVar15 < 10) {
      wVar16 = L'\n' - sVar15;
    }
    player_over_exert(player,L'È',wVar16,(int)(player->chp / 10));
    if (player->is_dead != false) {
      return;
    }
    piVar20 = player->timed;
  }
  if (piVar20[0x2b] != 0) {
    ident = false;
    sVar38 = source_player();
    origin.which = sVar38.which;
    origin._4_4_ = 0;
    origin.what = sVar38.what;
    effect_simple(L'\x03',origin,"30",L'\0',L'\0',L'\0',L'\0',L'\0',&ident);
    piVar20 = player->timed;
  }
  if (piVar20[0x32] != 0) {
    uVar18 = Rand_div(2);
    if (uVar18 == 0) {
      msg("The Black Breath sickens you.");
      player_stat_dec(player,L'\x04',false);
    }
    uVar18 = Rand_div(2);
    if (uVar18 == 0) {
      msg("The Black Breath saps your strength.");
      player_stat_dec(player,L'\0',false);
    }
    uVar18 = Rand_div(2);
    if (uVar18 == 0) {
      iVar19 = player->exp;
      uVar3 = z_info->life_drain_percent;
      msg("The Black Breath dims your life force.");
      player_exp_lose(player,(uint)uVar3 * (iVar19 / 100) + 100,false);
    }
  }
  _Var13 = player_timed_grade_eq(player,L'\n',"Full");
  if (_Var13) {
    player_dec_timed(player,L'\n',5000 / z_info->food_value,false,true);
    ppVar31 = player;
    puVar1 = &player->upkeep->update;
    *puVar1 = *puVar1 | 1;
  }
  else {
    if (turn % 100 == 0) {
      uVar29 = (uint)z_info->move_energy *
               (uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                     [(player->state).speed];
      uVar3 = z_info->food_value;
      _Var13 = player_of_has(player,L'\f');
      _Var14 = player_of_has(player,L'\n');
      uVar29 = ((uVar29 - uVar29 % 100) / (uint)uVar3 << _Var13) >> _Var14;
      player_dec_timed(player,L'\n',uVar29 + (uVar29 == 0),false,true);
    }
    ppVar31 = player;
    if ((player->timed[0x2b] != 0) &&
       (player_dec_timed(player,L'\n',(uint)z_info->food_value << 3,false,true), ppVar31 = player,
       player->timed[10] < PY_FOOD_HUNGRY)) {
      player_set_timed(player,L'+',L'\0',true,true);
      ppVar31 = player;
    }
  }
  _Var13 = player_timed_grade_eq(ppVar31,L'\n',"Faint");
  if (_Var13) {
    if ((player->timed[3] == 0) && (uVar18 = Rand_div(10), uVar18 == 0)) {
      msg("You faint from the lack of food.");
      disturb(player);
      ppVar31 = player;
      uVar18 = Rand_div(5);
      player_inc_timed(ppVar31,L'\x03',uVar18 + L'\x01',true,true,false);
    }
  }
  else {
    _Var13 = player_timed_grade_eq(player,L'\n',"Starving");
    ppVar31 = player;
    if (_Var13) {
      wVar16 = player_apply_damage_reduction(player,(PY_FOOD_STARVE - player->timed[10]) / 10);
      take_hit(ppVar31,wVar16,"starvation");
      if (player->is_dead != false) {
        return;
      }
    }
  }
  if (player->chp < player->mhp) {
    player_regen_hp(player);
  }
  player_regen_mana(player);
  local_80 = (player *)CONCAT44(local_80._4_4_,adj_con_fix[(player->state).stat_ind[4]] + 1);
  for (lVar34 = 0; lVar34 != 0x35; lVar34 = lVar34 + 1) {
    if (player->timed[lVar34] != 0) {
      wVar16 = (wchar_t)lVar34;
      wVar17 = L'\x01';
      switch(wVar16) {
      case L'\a':
      case L'\t':
switchD_00142533_caseD_7:
        wVar17 = (wchar_t)local_80;
        break;
      case L'\b':
        _Var13 = player_timed_grade_eq(player,L'\b',"Mortal Wound");
        _Var14 = flag_has_dbg((player->state).pflags,3,0xd,"player->state.pflags","(PF_ROCK)");
        wVar17 = L'\0';
        if (!_Var14 && !_Var13) goto switchD_00142533_caseD_7;
        break;
      case L'\n':
        wVar17 = L'\0';
        break;
      default:
        if (wVar16 == L',') {
          mon = get_commanded_monster();
          _Var13 = los(cave,player->grid,(loc_conflict)mon->grid);
          if (_Var13) {
            mon_dec_timed((monster *)mon,L'\b',L'\x01',L'\0');
          }
          else {
            mon_clear_timed((monster *)mon,L'\b',L'\x01');
            player_clear_timed(player,L',',true,true);
          }
        }
      }
      player_dec_timed(player,wVar16,wVar17,false,true);
    }
  }
  local_68 = c;
  for (uVar30 = 0; c_00 = local_68, uVar30 < (player->body).count; uVar30 = uVar30 + 1) {
    poVar6 = (player->body).slots[uVar30].obj;
    if ((poVar6 != (object *)0x0) && (pcVar7 = poVar6->curses, pcVar7 != (curse_data *)0x0)) {
      lVar34 = 0;
      paVar21 = z_info;
      for (uVar35 = 0; uVar35 < paVar21->curse_max; uVar35 = uVar35 + 1) {
        if (pcVar7[uVar35].power != L'\0') {
          pwVar2 = &pcVar7[uVar35].timeout;
          *pwVar2 = *pwVar2 + L'\xffffffff';
          pcVar12 = curses;
          if (*pwVar2 == L'\0') {
            _Var13 = do_curse_effect((wchar_t)uVar35,(player->body).slots[uVar30].obj);
            if (_Var13) {
              player_learn_curse(player,(curse *)(pcVar12->conflict_flags + lVar34 + -0x28));
            }
            wVar16 = randcalc(*(random_value *)
                               (*(long *)(pcVar12->conflict_flags + lVar34 + -0x10) + 0x108),0,
                              RANDOMISE);
            pcVar7[uVar35].timeout = wVar16;
            paVar21 = z_info;
          }
        }
        lVar34 = lVar34 + 0x38;
      }
    }
  }
  player_update_light(player);
  _Var13 = player_is_resting(player);
  if (!_Var13) {
    grid = player->grid;
    local_80 = player;
    sVar15 = player->timed[0x2e];
    local_78 = grid;
    q = q_new((long)cave->width * (long)cave->height);
    pcVar11 = cave;
    iVar19 = cave->height;
    for (lVar34 = 1; lVar34 < (long)iVar19 + -1; lVar34 = lVar34 + 1) {
      iVar5 = pcVar11->width;
      for (lVar32 = 1; lVar32 < (long)iVar5 + -1; lVar32 = lVar32 + 1) {
        (pcVar11->noise).grids[lVar34][lVar32] = 0;
      }
    }
    uVar29 = (uint)(sVar15 != 0) * 3 + 1;
    (pcVar11->noise).grids[(long)grid >> 0x20][grid.x] = 0;
    wVar16 = grid_to_i(grid,pcVar11->width);
    q_push(q,(long)wVar16);
    local_70 = CONCAT44(local_70._4_4_,uVar29);
    while (sVar22 = q_len(q), sVar22 != 0) {
      uVar23 = q_pop(q);
      i_to_grid((wchar_t)uVar23,cave->width,&local_78);
      if (uVar29 == (cave->noise).grids[local_78.y][local_78.x]) {
        wVar16 = grid_to_i(local_78,cave->width);
        q_push(q,(long)wVar16);
        uVar29 = uVar29 + (int)local_70;
      }
      else {
        for (lVar34 = 0; lVar34 != 8; lVar34 = lVar34 + 1) {
          lVar24 = (loc)loc_sum(local_78,(loc_conflict)ddgrid_ddd[lVar34]);
          _Var13 = square_in_bounds(cave,lVar24);
          if ((_Var13) && (_Var13 = square_isnoflow(cave,lVar24), !_Var13)) {
            if (((cave->noise).grids[(long)lVar24 >> 0x20][lVar24.x] == 0) &&
               (_Var13 = loc_eq(local_80->grid,(loc_conflict)lVar24), pcVar11 = cave, !_Var13)) {
              (cave->noise).grids[(long)lVar24 >> 0x20][lVar24.x] = (uint16_t)uVar29;
              wVar16 = grid_to_i((loc_conflict)lVar24,pcVar11->width);
              q_push(q,(long)wVar16);
            }
          }
          c_00 = local_68;
        }
      }
    }
    q_free(q);
    pcVar11 = cave;
    iVar19 = cave->height;
    for (lVar34 = 1; lVar34 < (long)iVar19 + -1; lVar34 = lVar34 + 1) {
      iVar5 = pcVar11->width;
      for (lVar32 = 1; lVar32 < (long)iVar5 + -1; lVar32 = lVar32 + 1) {
        puVar8 = (pcVar11->scent).grids[lVar34];
        uVar4 = puVar8[lVar32];
        if (uVar4 != 0) {
          puVar8[lVar32] = uVar4 + 1;
        }
      }
    }
    if (player->timed[0x2e] == 0) {
      for (uVar30 = 0; uVar30 != 5; uVar30 = uVar30 + 1) {
        local_5c = (int)uVar30 + -2;
        local_48 = &DAT_0024bf70 + uVar30 * 5;
        local_58 = uVar30 ^ 2;
        local_50 = uVar30;
        for (lVar34 = 0; lVar34 != 5; lVar34 = lVar34 + 1) {
          local_70 = (ulong)(uint)local_48[lVar34];
          wVar17 = (player->grid).y + local_5c;
          local_38 = (ulong)(uint)wVar17;
          wVar16 = (int)lVar34 + (player->grid).x + L'\xfffffffe';
          local_40 = (ulong)(uint)wVar16;
          lVar24.y = wVar17;
          lVar24.x = wVar16;
          _Var13 = square_in_bounds(cave,lVar24);
          if ((_Var13) && (_Var13 = square_isnoscent(cave,lVar24), !_Var13)) {
            local_80 = (player *)CONCAT71(local_80._1_7_,lVar34 == 2 && local_58 == 0);
            iVar19 = (int)local_70;
            bVar33 = 0;
            for (lVar32 = 0; lVar32 != 8; lVar32 = lVar32 + 1) {
              grid_00 = (loc)loc_sum((loc_conflict)lVar24,(loc_conflict)ddgrid_ddd[lVar32]);
              _Var13 = square_in_bounds(cave,grid_00);
              if (_Var13) {
                bVar33 = bVar33 | (byte)local_80 |
                         iVar19 - 1U == (uint)(cave->scent).grids[(long)grid_00 >> 0x20][grid_00.x];
              }
            }
            c_00 = local_68;
            uVar30 = local_50;
            if ((bVar33 & 1) != 0) {
              (cave->scent).grids[(int)local_38][(int)local_40] = (uint16_t)local_70;
            }
          }
        }
      }
    }
  }
  _Var13 = player_of_has(player,L'\x1b');
  if (_Var13) {
    if ((0 < player->exp) && (uVar18 = Rand_div(10), uVar18 == 0)) {
      iVar19 = damroll(10,6);
      player_exp_lose(player,(int)((player->exp / 100) * (uint)z_info->life_drain_percent + iVar19)
                             / 10,false);
    }
    equip_learn_flag(player,L'\x1b');
  }
  ppoVar36 = &player->gear;
  do {
    poVar6 = *ppoVar36;
    if (poVar6 == (object *)0x0) {
      for (uVar30 = 1; uVar30 < cave->obj_max; uVar30 = uVar30 + 1) {
        poVar6 = cave->objects[uVar30];
        if ((poVar6 != (object *)0x0) && (_Var13 = tval_can_have_timeout(poVar6), _Var13)) {
          recharge_timeout(poVar6);
        }
      }
      if (turn % 100 == 0) {
        equip_learn_after_time(player);
      }
      for (wVar16 = L'\0'; ppVar31 = player, wVar16 < c_00->height; wVar16 = wVar16 + L'\x01') {
        for (wVar17 = L'\0'; wVar17 < c_00->width; wVar17 = wVar17 + L'\x01') {
          lVar24 = (loc)loc(wVar17,wVar16);
          psVar26 = square((chunk_conflict *)c_00,lVar24);
          bVar37 = false;
          pptVar27 = &psVar26->trap;
          while (ptVar9 = *pptVar27, ptVar9 != (trap *)0x0) {
            if (ptVar9->timeout != '\0') {
              uVar28 = ptVar9->timeout + 0xff;
              ptVar9->timeout = uVar28;
              bVar37 = (bool)(bVar37 | uVar28 == '\0');
            }
            pptVar27 = &ptVar9->next;
          }
          if ((bVar37) && (_Var13 = square_isseen((chunk_conflict *)c_00,lVar24), _Var13)) {
            square_memorize_traps(c_00,lVar24);
            square_light_spot(c_00,lVar24);
          }
        }
      }
      if (((player->word_recall != 0) && (player->upkeep->arena_level == false)) &&
         (sVar15 = player->word_recall + -1, player->word_recall = sVar15, sVar15 == 0)) {
        disturb(ppVar31);
        cmdq_flush();
        if (player->depth == 0) {
          msgt(0x19,"You feel yourself yanked downwards!");
          player_set_recall_depth(player);
          wVar16 = (wchar_t)player->recall_depth;
        }
        else {
          msgt(0x19,"You feel yourself yanked upwards!");
          wVar16 = L'\0';
        }
        dungeon_change_level(player,wVar16);
      }
      ppVar31 = player;
      if ((player->deep_descent != 0) &&
         (sVar15 = player->deep_descent + -1, player->deep_descent = sVar15, sVar15 == 0)) {
        wVar16 = dungeon_get_next_level
                           (ppVar31,(int)ppVar31->max_depth,
                            (uint)(ushort)(4 / z_info->stair_skip + 1));
        disturb(player);
        if (player->depth < wVar16) {
          msgt(0x19,"The floor opens beneath you!");
          dungeon_change_level(player,wVar16);
        }
        else {
          msgt(0x19,"You are thrown back in an explosion!");
          sVar38 = source_none();
          origin_00.which = sVar38.which;
          origin_00._4_4_ = 0;
          origin_00.what = sVar38.what;
          effect_simple(L'?',origin_00,"0",L'\0',L'\x05',L'\0',L'\0',L'\0',(_Bool *)0x0);
        }
      }
      return;
    }
    if (poVar6->kind == (object_kind *)0x0) {
      __assert_fail("obj->kind",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/game-world.c"
                    ,0xce,"void recharge_objects(void)");
    }
    uVar10 = *(undefined8 *)&(player->body).count;
    body.name._4_4_ = (int)((ulong)(player->body).name >> 0x20);
    body._0_12_ = *(undefined1 (*) [12])&player->body;
    body._16_4_ = (int)uVar10;
    body._20_4_ = (int)((ulong)uVar10 >> 0x20);
    body.slots = (player->body).slots;
    _Var13 = object_is_equipped(body,poVar6);
    if (_Var13) {
      _Var13 = recharge_timeout(poVar6);
      if (_Var13) {
        recharged_notice(poVar6,true);
        ppVar25 = player->upkeep;
        uVar29 = 0x40000;
LAB_00142c33:
        ppVar25->redraw = ppVar25->redraw | uVar29;
      }
    }
    else {
      wVar16 = number_charging(poVar6);
      bVar33 = poVar6->number;
      _Var13 = tval_can_have_timeout(poVar6);
      if ((_Var13) && (_Var13 = recharge_timeout(poVar6), _Var13)) {
        if ((poVar6->timeout == 0) || (wVar16 == (uint)bVar33)) {
          recharged_notice(poVar6,poVar6->timeout == 0);
        }
        ppVar25 = player->upkeep;
        ppVar25->notice = ppVar25->notice | 1;
        uVar29 = 0x20000;
        goto LAB_00142c33;
      }
    }
    ppoVar36 = &poVar6->next;
  } while( true );
}

Assistant:

void process_world(struct chunk *c)
{
	int i, y, x;

	/* Compact the monster list if we're approaching the limit */
	if (cave_monster_count(c) + 32 > z_info->level_monster_max)
		compact_monsters(c, 64);

	/* Too many holes in the monster list - compress */
	if (cave_monster_count(c) + 32 < cave_monster_max(c))
		compact_monsters(c, 0);

	/*** Check the Time ***/

	/* Play an ambient sound at regular intervals. */
	if (!(turn % ((10L * z_info->day_length) / 4)))
		play_ambient_sound();

	/* Handle stores and sunshine */
	if (!player->depth) {
		/* Daybreak/Nighfall in town */
		if (!(turn % ((10L * z_info->day_length) / 2))) {
			/* Check for dawn */
			bool dawn = (!(turn % (10L * z_info->day_length)));

			if (dawn) {
				/* Day breaks */
				msg("The sun has risen.");
			} else {
				/* Night falls */
				msg("The sun has fallen.");
			}

			/* Illuminate */
			cave_illuminate(c, dawn);
		}
	} else {
		/* Update the stores once a day (while in the dungeon).
		   The changes are not actually made until return to town,
		   to avoid giving details away in the knowledge menu. */
		if (!(turn % (10L * z_info->store_turns))) daycount++;
	}

	/* Check for light change */
	if (player_has(player, PF_UNLIGHT)) {
		player->upkeep->update |= PU_BONUS;
	}

	/* Check for creature generation */
	if (one_in_(z_info->alloc_monster_chance)) {
		(void)pick_and_place_distant_monster(c, player->grid,
			z_info->max_sight + 5, true, player->depth);
	}

	/*** Damage (or healing) over Time ***/

	/* Take damage from poison */
	if (player->timed[TMD_POISONED]) {
		take_hit(player, player_apply_damage_reduction(player, 1),
			"poison");
		if (player->is_dead) {
			return;
		}
	}

	/* Take damage from cuts, worse from serious cuts */
	if (player->timed[TMD_CUT]) {
		if (player_has(player, PF_ROCK)) {
			/* Rock players just maintain */
			i = 0;
		} else if (player_timed_grade_eq(player, TMD_CUT, "Mortal Wound") ||
				   player_timed_grade_eq(player, TMD_CUT, "Deep Gash")) {
			i = 3;
		} else if (player_timed_grade_eq(player, TMD_CUT, "Severe Cut")) {
			i = 2;
		} else {
			i = 1;
		}

		/* Take damage */
		take_hit(player, player_apply_damage_reduction(player, i),
			"a fatal wound");
		if (player->is_dead) {
			return;
		}
	}

	/* Side effects of diminishing bloodlust */
	if (player->timed[TMD_BLOODLUST]) {
		player_over_exert(player, PY_EXERT_HP | PY_EXERT_CUT | PY_EXERT_SLOW,
						  MAX(0, 10 - player->timed[TMD_BLOODLUST]),
						  player->chp / 10);
		if (player->is_dead) {
			return;
		}
	}

	/* Timed healing */
	if (player->timed[TMD_HEAL]) {
		bool ident = false;
		effect_simple(EF_HEAL_HP, source_player(), "30", 0, 0, 0, 0, 0, &ident);
	}

	/* Effects of Black Breath */
	if (player->timed[TMD_BLACKBREATH]) {
		if (one_in_(2)) {
			msg("The Black Breath sickens you.");
			player_stat_dec(player, STAT_CON, false);
		}
		if (one_in_(2)) {
			msg("The Black Breath saps your strength.");
			player_stat_dec(player, STAT_STR, false);
		}
		if (one_in_(2)) {
			/* Life draining */
			int drain = 100 + (player->exp / 100) * z_info->life_drain_percent;
			msg("The Black Breath dims your life force.");
			player_exp_lose(player, drain, false);
		}
	}

	/*** Check the Food, and Regenerate ***/

	/* Digest */
	if (!player_timed_grade_eq(player, TMD_FOOD, "Full")) {
		/* Digest normally */
		if (!(turn % 100)) {
			/* Basic digestion rate based on speed */
			i = turn_energy(player->state.speed);

			/* Adjust for food value */
			i = (i * 100) / z_info->food_value;

			/* Regeneration takes more food */
			if (player_of_has(player, OF_REGEN)) i *= 2;

			/* Slow digestion takes less food */
			if (player_of_has(player, OF_SLOW_DIGEST)) i /= 2;

			/* Minimal digestion */
			if (i < 1) i = 1;

			/* Digest some food */
			player_dec_timed(player, TMD_FOOD, i, false, true);
		}

		/* Fast metabolism */
		if (player->timed[TMD_HEAL]) {
			player_dec_timed(player, TMD_FOOD,
				8 * z_info->food_value, false, true);
			if (player->timed[TMD_FOOD] < PY_FOOD_HUNGRY) {
				player_set_timed(player, TMD_HEAL, 0, true,
					true);
			}
		}
	} else {
		/* Digest quickly when gorged */
		player_dec_timed(player, TMD_FOOD, 5000 / z_info->food_value,
			false, true);
		player->upkeep->update |= PU_BONUS;
	}

	/* Faint or starving */
	if (player_timed_grade_eq(player, TMD_FOOD, "Faint")) {
		/* Faint occasionally */
		if (!player->timed[TMD_PARALYZED] && one_in_(10)) {
			/* Message */
			msg("You faint from the lack of food.");
			disturb(player);

			/* Faint (bypass free action) */
			(void)player_inc_timed(player, TMD_PARALYZED,
				1 + randint0(5), true, true, false);
		}
	} else if (player_timed_grade_eq(player, TMD_FOOD, "Starving")) {
		/* Calculate damage */
		i = (PY_FOOD_STARVE - player->timed[TMD_FOOD]) / 10;

		/* Take damage */
		take_hit(player, player_apply_damage_reduction(player, i),
			"starvation");
		if (player->is_dead) {
			return;
		}
	}

	/* Regenerate Hit Points if needed */
	if (player->chp < player->mhp)
		player_regen_hp(player);

	/* Regenerate or lose mana */
	player_regen_mana(player);

	/* Timeout various things */
	decrease_timeouts();

	/* Process light */
	player_update_light(player);

	/* Update noise and scent (not if resting) */
	if (!player_is_resting(player)) {
		make_noise(player);
		update_scent();
	}


	/*** Process Inventory ***/

	/* Handle experience draining */
	if (player_of_has(player, OF_DRAIN_EXP)) {
		if ((player->exp > 0) && one_in_(10)) {
			int32_t d = damroll(10, 6) +
				(player->exp / 100) * z_info->life_drain_percent;
			player_exp_lose(player, d / 10, false);
		}

		equip_learn_flag(player, OF_DRAIN_EXP);
	}

	/* Recharge activatable objects and rods */
	recharge_objects();

	/* Notice things after time */
	if (!(turn % 100))
		equip_learn_after_time(player);

	/* Decrease trap timeouts */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			struct trap *trap = square(c, grid)->trap;
			bool changed = false;
			while (trap) {
				if (trap->timeout) {
					trap->timeout--;
					if (!trap->timeout) {
						changed = true;
					}
				}
				trap = trap->next;
			}
			if (changed && square_isseen(c, grid)) {
				square_memorize_traps(c, grid);
				square_light_spot(c, grid);
			}
		}
	}


	/*** Involuntary Movement ***/

	/* Delayed Word-of-Recall; suspended in arenas */
	if (player->word_recall && !player->upkeep->arena_level) {
		/* Count down towards recall */
		player->word_recall--;

		/* Activate the recall */
		if (!player->word_recall) {
			/*
			 * Disturbing!  Also, flush the command queue to avoid
			 * losing an action on the new level
			 */
			disturb(player);
			cmdq_flush();

			/* Determine the level */
			if (player->depth) {
				msgt(MSG_TPLEVEL, "You feel yourself yanked upwards!");
				dungeon_change_level(player, 0);
			} else {
				msgt(MSG_TPLEVEL, "You feel yourself yanked downwards!");
				player_set_recall_depth(player);
				dungeon_change_level(player, player->recall_depth);
			}
		}
	}

	/* Delayed Deep Descent */
	if (player->deep_descent) {
		/* Count down towards descent */
		player->deep_descent--;

		/* Activate the descent */
		if (player->deep_descent == 0) {
			/* Calculate target depth */
			int target_increment = (4 / z_info->stair_skip) + 1;
			int target_depth = dungeon_get_next_level(player,
				player->max_depth, target_increment);
			disturb(player);

			/* Determine the level */
			if (target_depth > player->depth) {
				msgt(MSG_TPLEVEL, "The floor opens beneath you!");
				dungeon_change_level(player, target_depth);
			} else {
				/* Otherwise do something disastrous */
				msgt(MSG_TPLEVEL, "You are thrown back in an explosion!");
				effect_simple(EF_DESTRUCTION, source_none(), "0", 0, 5, 0, 0, 0, NULL);
			}
		}
	}
}